

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseOffsetOpt(WastParser *this,uint32_t *out_offset)

{
  Location loc;
  bool bVar1;
  Result result;
  const_iterator s;
  const_iterator end;
  size_type sVar2;
  const_pointer pcVar3;
  undefined8 in_R9;
  undefined1 local_78 [8];
  string_view sv;
  uint64_t offset64;
  Token token;
  uint32_t *out_offset_local;
  WastParser *this_local;
  
  token.field_2.literal_.text.size_ = (size_type)out_offset;
  bVar1 = PeekMatch(this,OffsetEqNat);
  if (bVar1) {
    Consume((Token *)&offset64,this);
    _local_78 = Token::text((Token *)&offset64);
    s = string_view::begin((string_view *)local_78);
    end = string_view::end((string_view *)local_78);
    result = ParseInt64(s,end,&sv.size_,SignedAndUnsigned);
    bVar1 = Failed(result);
    if (bVar1) {
      sVar2 = string_view::length((string_view *)local_78);
      pcVar3 = string_view::data((string_view *)local_78);
      loc.filename.size_ = (size_type)token.loc.filename.data_;
      loc.filename.data_ = (char *)offset64;
      loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           token.loc.filename.size_;
      loc.field_1._8_8_ = token.loc.field_1.field_1.offset;
      Error(this,loc,"invalid offset \"%.*s\"",sVar2 & 0xffffffff,pcVar3,token.loc.filename.size_,
            in_R9);
    }
    if (0xffffffff < sv.size_) {
      Error(this,0x3f7182);
    }
    *(int *)token.field_2.literal_.text.size_ = (int)sv.size_;
    this_local._7_1_ = true;
  }
  else {
    *(undefined4 *)token.field_2.literal_.text.size_ = 0;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseOffsetOpt(uint32_t* out_offset) {
  WABT_TRACE(ParseOffsetOpt);
  if (PeekMatch(TokenType::OffsetEqNat)) {
    Token token = Consume();
    uint64_t offset64;
    string_view sv = token.text();
    if (Failed(ParseInt64(sv.begin(), sv.end(), &offset64,
                          ParseIntType::SignedAndUnsigned))) {
      Error(token.loc, "invalid offset \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }
    if (offset64 > UINT32_MAX) {
      Error(token.loc, "offset must be less than or equal to 0xffffffff");
    }

    *out_offset = static_cast<uint32_t>(offset64);
    return true;
  } else {
    *out_offset = 0;
    return false;
  }
}